

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O1

void __thiscall efsw::DirWatcherGeneric::~DirWatcherGeneric(DirWatcherGeneric *this)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pFVar3;
  char *__end;
  DirectorySnapshotDiff Diff;
  string local_130;
  string local_110;
  DirectorySnapshotDiff local_f0;
  
  if (this->Deleted == true) {
    DirectorySnapshot::scan(&local_f0,&this->DirSnap);
    bVar1 = DirectorySnapshot::exists(&this->DirSnap);
    if (!bVar1) {
      if (local_f0.FilesDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_f0.FilesDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pFVar3 = local_f0.FilesDeleted.
                 super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"","");
          handleAction(this,&pFVar3->Filepath,2,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          pFVar3 = pFVar3 + 1;
        } while (pFVar3 != local_f0.FilesDeleted.
                           super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_f0.DirsDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_f0.DirsDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pFVar3 = local_f0.DirsDeleted.
                 super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"","");
          handleAction(this,&pFVar3->Filepath,2,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          pFVar3 = pFVar3 + 1;
        } while (pFVar3 != local_f0.DirsDeleted.
                           super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~vector(&local_f0.DirsMoved);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f0.DirsModified);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f0.DirsCreated);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f0.DirsDeleted);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~vector(&local_f0.FilesMoved);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f0.FilesModified);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f0.FilesCreated);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f0.FilesDeleted);
  }
  for (p_Var2 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (this->Deleted == true) {
      *(undefined1 *)(*(long *)(p_Var2 + 2) + 0xb9) = 1;
    }
    this_00 = *(DirWatcherGeneric **)(p_Var2 + 2);
    if (this_00 != (DirWatcherGeneric *)0x0) {
      ~DirWatcherGeneric(this_00);
      operator_delete(this_00);
      *(undefined8 *)(p_Var2 + 2) = 0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
  ::~_Rb_tree(&(this->Directories)._M_t);
  DirectorySnapshot::~DirectorySnapshot(&this->DirSnap);
  return;
}

Assistant:

DirWatcherGeneric::~DirWatcherGeneric() {
	/// If the directory was deleted mark the files as deleted
	if ( Deleted ) {
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( !DirSnap.exists() ) {
			FileInfoList::iterator it;

			DiffIterator( FilesDeleted ) {
				handleAction( ( *it ).Filepath, Actions::Delete );
			}

			DiffIterator( DirsDeleted ) {
				handleAction( ( *it ).Filepath, Actions::Delete );
			}
		}
	}

	DirWatchMap::iterator it = Directories.begin();

	for ( ; it != Directories.end(); ++it ) {
		if ( Deleted ) {
			/// If the directory was deleted, mark the flag for file deletion
			it->second->Deleted = true;
		}

		efSAFE_DELETE( it->second );
	}
}